

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O1

bool __thiscall
bssl::NormalizeName(bssl *this,Input name_rdn_sequence,string *normalized_rdn_sequence,
                   CertErrors *errors)

{
  uint tag;
  pointer pXVar1;
  bool bVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  size_t sVar6;
  X509NameAttribute *pXVar7;
  Input input;
  RelativeDistinguishedName type_and_values;
  string normalized_value;
  ScopedCBB cbb;
  CBB value_cbb;
  Parser rdn_parser;
  Parser rdn_sequence_parser;
  CBB type_cbb;
  CBB attribute_type_and_value_cbb;
  CBB rdn_cbb;
  RelativeDistinguishedName local_198;
  string local_178;
  string *local_158;
  CBB local_150;
  CBB local_120;
  Parser local_f0;
  Parser local_d8;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  local_158 = (string *)name_rdn_sequence.data_.size_;
  if (normalized_rdn_sequence == (string *)0x0) {
    abort();
  }
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_d8,input);
  CBB_zero(&local_150);
  iVar3 = CBB_init(&local_150,0);
  if (iVar3 == 0) {
LAB_004c4bec:
    bVar2 = false;
  }
  else {
    do {
      bVar2 = der::Parser::HasMore(&local_d8);
      if (!bVar2) {
        puVar4 = CBB_data(&local_150);
        puVar5 = CBB_data(&local_150);
        sVar6 = CBB_len(&local_150);
        bVar2 = true;
        ::std::__cxx11::string::_M_replace_dispatch<unsigned_char_const*>
                  (local_158,*(long *)local_158,*(long *)(local_158 + 8) + *(long *)local_158,puVar4
                   ,puVar5 + sVar6);
        break;
      }
      der::Parser::Parser(&local_f0);
      bVar2 = der::Parser::ReadConstructed(&local_d8,0x20000011,&local_f0);
      if (!bVar2) goto LAB_004c4bec;
      local_198.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (X509NameAttribute *)0x0;
      local_198.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (X509NameAttribute *)0x0;
      local_198.
      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ReadRdn(&local_f0,&local_198);
      if ((!bVar2) ||
         (iVar3 = CBB_add_asn1(&local_150,&local_60,0x20000011),
         pXVar1 = local_198.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
         pXVar7 = local_198.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start, iVar3 == 0)) {
LAB_004c4bd5:
        if (local_198.
            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
          operator_delete(local_198.
                          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_198.
                                super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.
                                super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_004c4bec;
      }
      for (; pXVar7 != pXVar1; pXVar7 = pXVar7 + 1) {
        iVar3 = CBB_add_asn1(&local_60,&local_90,0x20000010);
        if (((iVar3 == 0) || (iVar3 = CBB_add_asn1(&local_90,&local_c0,6), iVar3 == 0)) ||
           (iVar3 = CBB_add_bytes(&local_c0,(pXVar7->type).data_.data_,(pXVar7->type).data_.size_),
           iVar3 == 0)) goto LAB_004c4bd5;
        tag = pXVar7->value_tag;
        if ((tag < 0x1f) && ((0x50481000U >> (tag & 0x1f) & 1) != 0)) {
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          local_178._M_string_length = 0;
          local_178.field_2._M_local_buf[0] = '\0';
          bVar2 = anon_unknown_1::NormalizeValue
                            (*pXVar7,&local_178,(CertErrors *)normalized_rdn_sequence);
          if ((!bVar2) ||
             ((iVar3 = CBB_add_asn1(&local_90,&local_120,0xc), iVar3 == 0 ||
              (iVar3 = CBB_add_bytes(&local_120,(uint8_t *)local_178._M_dataplus._M_p,
                                     local_178._M_string_length), iVar3 == 0)))) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                       local_178.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_004c4bd5;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                     local_178.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          iVar3 = CBB_add_asn1(&local_90,&local_120,tag);
          if ((iVar3 == 0) ||
             (iVar3 = CBB_add_bytes(&local_120,(pXVar7->value).data_.data_,
                                    (pXVar7->value).data_.size_), iVar3 == 0)) goto LAB_004c4bd5;
        }
        iVar3 = CBB_flush(&local_60);
        if (iVar3 == 0) goto LAB_004c4bd5;
      }
      iVar3 = CBB_flush_asn1_set_of(&local_60);
      if (iVar3 == 0) goto LAB_004c4bd5;
      iVar3 = CBB_flush(&local_150);
      if (local_198.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
        operator_delete(local_198.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_198.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar2 = false;
    } while (iVar3 != 0);
  }
  CBB_cleanup(&local_150);
  return bVar2;
}

Assistant:

bool NormalizeName(der::Input name_rdn_sequence,
                   std::string *normalized_rdn_sequence, CertErrors *errors) {
  BSSL_CHECK(errors);

  // RFC 5280 section 4.1.2.4
  // RDNSequence ::= SEQUENCE OF RelativeDistinguishedName
  der::Parser rdn_sequence_parser(name_rdn_sequence);

  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 0)) {
    return false;
  }

  while (rdn_sequence_parser.HasMore()) {
    // RelativeDistinguishedName ::= SET SIZE (1..MAX) OF AttributeTypeAndValue
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    CBB rdn_cbb;
    if (!CBB_add_asn1(cbb.get(), &rdn_cbb, CBS_ASN1_SET)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      // AttributeTypeAndValue ::= SEQUENCE {
      //   type     AttributeType,
      //   value    AttributeValue }
      CBB attribute_type_and_value_cbb, type_cbb, value_cbb;
      if (!CBB_add_asn1(&rdn_cbb, &attribute_type_and_value_cbb,
                        CBS_ASN1_SEQUENCE)) {
        return false;
      }

      // AttributeType ::= OBJECT IDENTIFIER
      if (!CBB_add_asn1(&attribute_type_and_value_cbb, &type_cbb,
                        CBS_ASN1_OBJECT) ||
          !CBB_add_bytes(&type_cbb, type_and_value.type.data(),
                         type_and_value.type.size())) {
        return false;
      }

      // AttributeValue ::= ANY -- DEFINED BY AttributeType
      if (IsNormalizableDirectoryString(type_and_value.value_tag)) {
        std::string normalized_value;
        if (!NormalizeValue(type_and_value, &normalized_value, errors)) {
          return false;
        }
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          CBS_ASN1_UTF8STRING) ||
            !CBB_add_bytes(
                &value_cbb,
                reinterpret_cast<const uint8_t *>(normalized_value.data()),
                normalized_value.size())) {
          return false;
        }
      } else {
        if (!CBB_add_asn1(&attribute_type_and_value_cbb, &value_cbb,
                          type_and_value.value_tag) ||
            !CBB_add_bytes(&value_cbb, type_and_value.value.data(),
                           type_and_value.value.size())) {
          return false;
        }
      }

      if (!CBB_flush(&rdn_cbb)) {
        return false;
      }
    }

    // Ensure the encoded AttributeTypeAndValue values in the SET OF are sorted.
    if (!CBB_flush_asn1_set_of(&rdn_cbb) || !CBB_flush(cbb.get())) {
      return false;
    }
  }

  normalized_rdn_sequence->assign(CBB_data(cbb.get()),
                                  CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}